

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O2

char * cimg_library::cimg::ftype(FILE *file,char *filename)

{
  char cVar1;
  byte bVar2;
  uint mode;
  char *pcVar3;
  long lVar4;
  int iVar5;
  uint *puVar6;
  CImgArgumentException *this;
  char *pcVar7;
  long lVar8;
  char *pcVar9;
  bool bVar10;
  bool bVar11;
  char local_69;
  CImg<char> header;
  CImgList<char> _header;
  CImg<char> local_38;
  
  if (file == (FILE *)0x0 && filename == (char *)0x0) {
    this = (CImgArgumentException *)__cxa_allocate_exception(0x10);
    CImgArgumentException::CImgArgumentException
              (this,"cimg::ftype(): Specified filename is (null).");
    __cxa_throw(this,&CImgArgumentException::typeinfo,CImgException::~CImgException);
  }
  header._data = (char *)0x0;
  header._width = 0;
  header._height = 0;
  header._depth = 0;
  header._spectrum = 0;
  header._is_shared = false;
  puVar6 = exception_mode();
  mode = *puVar6;
  exception_mode(0);
  CImg<char>::_load_raw(&header,file,filename,0x200,1,1,1,false,false,0);
  pcVar7 = header._data;
  iVar5 = strncmp(header._data,"OFF\n",4);
  if (iVar5 == 0) {
    pcVar9 = "off";
    goto LAB_0011d093;
  }
  iVar5 = strncmp(pcVar7,"#INRIMAGE",9);
  if (iVar5 == 0) {
    pcVar9 = "inr";
    goto LAB_0011d093;
  }
  iVar5 = strncmp(pcVar7,"PANDORE",7);
  if (iVar5 == 0) {
    pcVar9 = "pan";
    goto LAB_0011d093;
  }
  iVar5 = strncmp(pcVar7 + 0x80,"DICM",4);
  if (iVar5 == 0) {
    pcVar9 = "dcm";
    goto LAB_0011d093;
  }
  cVar1 = *pcVar7;
  if (cVar1 == 'B') {
    if (pcVar7[1] == 'M') {
      pcVar9 = "bmp";
      goto LAB_0011d093;
    }
  }
  else if (cVar1 == 'G') {
    if ((((pcVar7[1] == 'I') && (pcVar7[2] == 'F')) && (pcVar7[3] == '8')) && (pcVar7[5] == 'a')) {
      pcVar9 = "gif";
      if ((pcVar7[4] == '7') || (pcVar7[4] == '9')) goto LAB_0011d093;
    }
  }
  else if (cVar1 == 'I') {
    if (pcVar7[1] == 'I') {
LAB_0011cf7f:
      pcVar9 = "tif";
      goto LAB_0011d093;
    }
  }
  else if (cVar1 == 'M') {
    if (pcVar7[1] == 'M') goto LAB_0011cf7f;
  }
  else if (cVar1 == -0x77) {
    if ((((pcVar7[1] == 'P') && (pcVar7[2] == 'N')) &&
        ((pcVar7[3] == 'G' &&
         (((pcVar7[4] == '\r' && (pcVar7[5] == '\n')) && (pcVar7[6] == '\x1a')))))) &&
       (pcVar7[7] == '\n')) {
      pcVar9 = "png";
      goto LAB_0011d093;
    }
  }
  else if (((cVar1 == -1) && (pcVar7[1] == -0x28)) && (pcVar7[2] == -1)) {
    pcVar9 = "jpg";
    goto LAB_0011d093;
  }
  local_69 = '\n';
  CImg<char>::vector(&local_38,&local_69);
  pcVar9 = (char *)0x0;
  CImg<char>::get_split<char>((CImg<char> *)&_header,&header,(char)&local_38,false);
  CImg<char>::~CImg(&local_38);
  pcVar7 = (char *)(ulong)_header._width;
  if ((int)_header._width < 1) {
    pcVar7 = pcVar9;
  }
  lVar4 = 0;
  do {
    lVar8 = lVar4;
    if ((long)pcVar7 * 0x20 + 0x20 == lVar8 + 0x20) goto LAB_0011d089;
    pcVar3 = *(char **)((long)&(_header._data)->_data + lVar8);
    cVar1 = *pcVar3;
    lVar4 = lVar8 + 0x20;
  } while (cVar1 == '#');
  if ((cVar1 == 'P') && (*(int *)((long)&(_header._data)->_height + lVar8) == 2)) {
    bVar2 = pcVar3[1];
    pcVar7 = (char *)0x0;
    bVar10 = 0xf6 < (byte)(bVar2 - 0x3a);
    if (bVar10) {
      pcVar7 = "pnm";
    }
    bVar11 = (bVar2 & 0xdf) != 0x46;
    pcVar9 = "pfm";
    if (bVar11) {
      pcVar9 = pcVar7;
    }
    if (bVar11 && !bVar10) goto LAB_0011d086;
  }
  else {
LAB_0011d086:
    pcVar9 = (char *)0x0;
  }
LAB_0011d089:
  CImgList<char>::~CImgList(&_header);
LAB_0011d093:
  exception_mode(mode);
  CImg<char>::~CImg(&header);
  return pcVar9;
}

Assistant:

inline const char *ftype(std::FILE *const file, const char *const filename) {
    if (!file && !filename)
      throw CImgArgumentException("cimg::ftype(): Specified filename is (null).");
    static const char
      *const _pnm = "pnm",
      *const _pfm = "pfm",
      *const _bmp = "bmp",
      *const _gif = "gif",
      *const _jpg = "jpg",
      *const _off = "off",
      *const _pan = "pan",
      *const _png = "png",
      *const _tif = "tif",
      *const _inr = "inr",
      *const _dcm = "dcm";
    const char *f_type = 0;
    CImg<char> header;
    const unsigned int omode = cimg::exception_mode();
    cimg::exception_mode(0);
    try {
      header._load_raw(file,filename,512,1,1,1,false,false,0);
      const unsigned char *const uheader = (unsigned char*)header._data;
      if (!std::strncmp(header,"OFF\n",4)) f_type = _off; // OFF.
      else if (!std::strncmp(header,"#INRIMAGE",9)) f_type = _inr; // INRIMAGE.
      else if (!std::strncmp(header,"PANDORE",7)) f_type = _pan; // PANDORE.
      else if (!std::strncmp(header.data() + 128,"DICM",4)) f_type = _dcm; // DICOM.
      else if (uheader[0]==0xFF && uheader[1]==0xD8 && uheader[2]==0xFF) f_type = _jpg;  // JPEG.
      else if (header[0]=='B' && header[1]=='M') f_type = _bmp;  // BMP.
      else if (header[0]=='G' && header[1]=='I' && header[2]=='F' && header[3]=='8' && header[5]=='a' && // GIF.
               (header[4]=='7' || header[4]=='9')) f_type = _gif;
      else if (uheader[0]==0x89 && uheader[1]==0x50 && uheader[2]==0x4E && uheader[3]==0x47 &&  // PNG.
               uheader[4]==0x0D && uheader[5]==0x0A && uheader[6]==0x1A && uheader[7]==0x0A) f_type = _png;
      else if ((uheader[0]==0x49 && uheader[1]==0x49) || (uheader[0]==0x4D && uheader[1]==0x4D)) f_type = _tif; // TIFF.
      else { // PNM or PFM.
        CImgList<char> _header = header.get_split(CImg<char>::vector('\n'),0,false);
        cimglist_for(_header,l) {
          if (_header(l,0)=='#') continue;
          if (_header[l]._height==2 && _header(l,0)=='P') {
            const char c = _header(l,1);
            if (c=='f' || c=='F') { f_type = _pfm; break; }
            if (c>='1' && c<='9') { f_type = _pnm; break; }
          }
          f_type = 0; break;
        }
      }
    } catch (CImgIOException&) { }
    cimg::exception_mode(omode);
    return f_type;
  }